

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O2

void __thiscall
Descriptor_Parse_Taproot_tapbranch_simple2_Test::~Descriptor_Parse_Taproot_tapbranch_simple2_Test
          (Descriptor_Parse_Taproot_tapbranch_simple2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Descriptor, Parse_Taproot_tapbranch_simple2) {
  std::string descriptor1 = "tr(c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5,{663e2b115c7bc9af54395266c7c0b0dc6f879c55ecaa0becb2e041ab1cfee294,0e167d3d619d2b16fb08736a6e696eb6814c6d99a578c8c268d4195aeb9f72d1})";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  DescriptorScriptReference script_ref;
  TapBranch tree;
  SchnorrPubkey pubkey;
  NetType nettype = NetType::kRegtest;

  try {
    desc = Descriptor::Parse(descriptor1);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
    return;
  }

  EXPECT_NO_THROW(script_ref = desc.GetReference());
  EXPECT_TRUE(script_ref.HasKey());
  EXPECT_TRUE(script_ref.HasAddress());
  EXPECT_EQ(1, script_ref.GetKeyNum());
  EXPECT_FALSE(script_ref.HasChild());
  EXPECT_FALSE(script_ref.HasReqNum());
  EXPECT_FALSE(script_ref.HasRedeemScript());
  EXPECT_TRUE(script_ref.HasTapBranch());
  EXPECT_FALSE(script_ref.HasScriptTree());
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(tree = script_ref.GetTapBranch());
  EXPECT_EQ(AddressType::kTaprootAddress, script_ref.GetAddressType());
  EXPECT_EQ(HashType::kTaproot, script_ref.GetHashType());
  EXPECT_STREQ(script_ref.GenerateAddress(nettype).GetAddress().c_str(),
      "bcrt1p6r63tl53d930my75e76ncsgw05gyk838e08079kxuuguwxr0yyjssdax9t");
  EXPECT_NO_THROW(pubkey = script_ref.GetKeyList()[0].GetSchnorrPubkey());
  EXPECT_STREQ(desc_str.c_str(), descriptor1.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
      "1 d0f515fe916962fd93d4cfb53c410e7d104b1e27cbceff16c6e711c7186f2125");
  EXPECT_STREQ(tree.ToString().c_str(),
      "{0e167d3d619d2b16fb08736a6e696eb6814c6d99a578c8c268d4195aeb9f72d1,663e2b115c7bc9af54395266c7c0b0dc6f879c55ecaa0becb2e041ab1cfee294}");
  EXPECT_STREQ(tree.GetCurrentBranchHash().GetHex().c_str(),
      "6c2c113096e1876557951f05211acde706640f832862fb40549d60d9421c7f14");
}